

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall curlpp::HttpPost::clear(HttpPost *this)

{
  if (this->mFirst != (curl_httppost *)0x0) {
    curl_formfree();
    this->mFirst = (curl_httppost *)0x0;
    this->mLast = (curl_httppost *)0x0;
  }
  std::__cxx11::
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ::clear(&this->mForms);
  return;
}

Assistant:

void
curlpp::HttpPost::clear()
{
  if(mFirst != NULL) {
    ::curl_formfree(mFirst);
    mFirst = NULL;
    mLast = NULL;
  }
  
  mForms.clear();
}